

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O1

void __thiscall
llvm::dwarf::CFIProgram::addInstruction(CFIProgram *this,uint8_t Opcode,uint64_t Operand1)

{
  SmallVectorStorage<unsigned_long,_2U> *pSVar1;
  Instruction local_70;
  uint64_t local_20;
  uint64_t Operand1_local;
  
  pSVar1 = &local_70.Ops.super_SmallVectorStorage<unsigned_long,_2U>;
  local_70.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  local_70.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity = 2;
  local_70.Expression.Storage.field_0.empty = '\0';
  local_70.Expression.Storage.hasVal = false;
  local_70.Opcode = Opcode;
  local_70.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX = pSVar1;
  local_20 = Operand1;
  std::
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ::emplace_back<llvm::dwarf::CFIProgram::Instruction>(&this->Instructions,&local_70);
  if ((SmallVectorStorage<unsigned_long,_2U> *)
      local_70.Ops.super_SmallVectorImpl<unsigned_long>.
      super_SmallVectorTemplateBase<unsigned_long,_true>.
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX != pSVar1) {
    free(local_70.Ops.super_SmallVectorImpl<unsigned_long>.
         super_SmallVectorTemplateBase<unsigned_long,_true>.
         super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX);
  }
  SmallVectorTemplateBase<unsigned_long,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_long,_true> *)
             &(this->Instructions).
              super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].Ops,&local_20);
  return;
}

Assistant:

void addInstruction(uint8_t Opcode, uint64_t Operand1) {
    Instructions.push_back(Instruction(Opcode));
    Instructions.back().Ops.push_back(Operand1);
  }